

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesOverclockGetControlState
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,
          zes_control_state_t *pControlState,zes_pending_action_t *pPendingAction)

{
  zes_pfnOverclockGetControlState_t pfnGetControlState;
  dditable_t *dditable;
  ze_result_t result;
  zes_pending_action_t *pPendingAction_local;
  zes_control_state_t *pControlState_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  if (*(code **)(*(long *)(hDomainHandle + 8) + 0xa28) == (code *)0x0) {
    hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDomainHandle_local._4_4_ =
         (**(code **)(*(long *)(hDomainHandle + 8) + 0xa28))
                   (*(undefined8 *)hDomainHandle,DomainControl,pControlState,pPendingAction);
  }
  return hDomainHandle_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetControlState(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Domain Control.
        zes_control_state_t* pControlState,             ///< [out] Current overclock control state.
        zes_pending_action_t* pPendingAction            ///< [out] Pending overclock setting.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_overclock_object_t*>( hDomainHandle )->dditable;
        auto pfnGetControlState = dditable->zes.Overclock.pfnGetControlState;
        if( nullptr == pfnGetControlState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDomainHandle = reinterpret_cast<zes_overclock_object_t*>( hDomainHandle )->handle;

        // forward to device-driver
        result = pfnGetControlState( hDomainHandle, DomainControl, pControlState, pPendingAction );

        return result;
    }